

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O2

void __thiscall FParser::OPequals(FParser *this,svalue_t *result,int start,int n,int stop)

{
  DFsVariable *this_00;
  
  this_00 = DFsScript::FindVariable(this->Script,this->Tokens[start]);
  if (this_00 != (DFsVariable *)0x0) {
    EvaluateExpression(this,result,n + 1,stop);
    DFsVariable::SetValue(this_00,result);
    return;
  }
  script_error("unknown variable \'%s\'\n",this->Tokens[start]);
  return;
}

Assistant:

void FParser::OPequals(svalue_t &result, int start, int n, int stop)
{
	DFsVariable *var;
	
	var = Script->FindVariable(Tokens[start]);
	
	if(var)
    {
		EvaluateExpression(result, n+1, stop);
		var->SetValue (result);
    }
	else
    {
		script_error("unknown variable '%s'\n", Tokens[start]);
    }
}